

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_begin_object
          (json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
           *this,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  reference pvVar1;
  size_type sVar2;
  vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_RCX;
  vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
  *in_RDI;
  json_object_arg_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  
  pvVar1 = std::
           vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
           ::back(in_RDI);
  if (pvVar1->type_ == root_t) {
    in_RDI[1].
    super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::clear((vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             *)0x1bdea8);
    *(undefined1 *)
     &in_RDI[5].
      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
  }
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           in_RDI[1].
           super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  in_RDI[1].
  super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&__args->field_0x1;
  std::
  vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
  ::
  emplace_back<std::__cxx11::string,unsigned_long,jsoncons::json_object_arg_t_const&,jsoncons::semantic_tag&>
            (in_RCX,__args,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(semantic_tag *)in_RDI);
  uVar3 = 2;
  sVar2 = std::
          vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ::size((vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  *)(in_RDI + 3));
  std::
  vector<jsoncons::json_decoder<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<char>>::structure_info,std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<char>>::structure_info>>
  ::
  emplace_back<jsoncons::json_decoder<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<char>>::structure_type,unsigned_long>
            ((vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
              *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),(structure_type *)(sVar2 - 1),
             (unsigned_long *)in_RDI);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag tag, const ser_context&, std::error_code&) override
    {
        if (structure_stack_.back().type_ == structure_type::root_t)
        {
            index_ = 0;
            item_stack_.clear();
            is_valid_ = false;
        }
        item_stack_.emplace_back(std::move(name_), index_++, json_object_arg, tag);
        structure_stack_.emplace_back(structure_type::object_t, item_stack_.size()-1);
        JSONCONS_VISITOR_RETURN;
    }